

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::CompressPiz
               (uchar *outPtr,uint *outSize,uchar *inPtr,size_t inSize,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channelInfo,
               int data_width,int num_lines)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference compressed;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  long lVar7;
  reference pvVar8;
  uchar *puVar9;
  unsigned_short *puVar10;
  reference pvVar11;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *pvVar12;
  ulong in_RCX;
  void *in_RDX;
  uint *in_RSI;
  ushort *in_RDI;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int length;
  int zero;
  char *lengthPtr;
  int j;
  PIZChannelData *cd_2;
  size_t i_1;
  char *buf;
  unsigned_short maxValue;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lut;
  size_t n;
  PIZChannelData *cd_1;
  size_t i;
  int y;
  uchar *ptr;
  size_t pixelSize;
  PIZChannelData *cd;
  size_t c;
  unsigned_short *tmpBufferEnd;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  size_type in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  allocator_type *in_stack_fffffffffffffe40;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *this;
  size_type in_stack_fffffffffffffe48;
  ushort *__dest;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
  *in_stack_fffffffffffffe50;
  unsigned_short *raw;
  undefined1 *puVar13;
  unsigned_short *in;
  int local_124;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *local_118;
  ushort *local_110;
  ulong local_d8;
  int local_cc;
  void *local_c8;
  ulong local_b0;
  reference local_a8;
  undefined1 local_99 [32];
  undefined1 local_79;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  ushort local_60;
  ushort local_5e [10];
  undefined1 local_49 [29];
  int local_2c;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *local_28;
  ulong local_20;
  void *local_18;
  uint *local_10;
  ushort *local_8;
  
  in = (unsigned_short *)local_49;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x46e2f3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,(allocator_type *)in_stack_fffffffffffffe40);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x46e31c);
  uVar2 = local_20 >> 1;
  puVar13 = &local_79;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x46e344);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,(allocator_type *)in_stack_fffffffffffffe40);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x46e370);
  sVar3 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::size(local_28)
  ;
  raw = (unsigned_short *)local_99;
  std::allocator<tinyexr::PIZChannelData>::allocator((allocator<tinyexr::PIZChannelData> *)0x46e397)
  ;
  std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<tinyexr::PIZChannelData>::~allocator
            ((allocator<tinyexr::PIZChannelData> *)0x46e3c0);
  compressed = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          in_stack_fffffffffffffe28);
  local_b0 = 0;
  local_a8 = compressed;
  while( true ) {
    sVar4 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::size
                      ((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *)
                       (local_99 + 1));
    if (sVar4 <= local_b0) break;
    pvVar5 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
             operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *
                        )(local_99 + 1),local_b0);
    pvVar5->start = local_a8;
    pvVar5->end = pvVar5->start;
    pvVar5->nx = local_2c;
    pvVar5->ny = in_stack_00000008;
    iVar1 = 2;
    pvVar6 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_28,local_b0);
    if (pvVar6->requested_pixel_type == 1) {
      iVar1 = 1;
    }
    pvVar5->size = iVar1;
    local_a8 = local_a8 + pvVar5->nx * pvVar5->ny * pvVar5->size;
    local_b0 = local_b0 + 1;
  }
  local_c8 = local_18;
  for (local_cc = 0; local_cc < in_stack_00000008; local_cc = local_cc + 1) {
    local_d8 = 0;
    while( true ) {
      sVar4 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::size
                        ((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          *)(local_99 + 1));
      if (sVar4 <= local_d8) break;
      pvVar5 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                           *)(local_99 + 1),local_d8);
      lVar7 = (long)(pvVar5->nx * pvVar5->size);
      memcpy(pvVar5->end,local_c8,lVar7 << 1);
      local_c8 = (void *)(lVar7 * 2 + (long)local_c8);
      pvVar5->end = pvVar5->end + lVar7;
      local_d8 = local_d8 + 1;
    }
  }
  pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                      CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                      in_stack_fffffffffffffe28);
  sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_78);
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x46e720);
  bitmapFromData(pvVar8,(int)sVar4,puVar9,local_5e,&local_60);
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x46e755);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,(allocator_type *)in_stack_fffffffffffffe40);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x46e77b);
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x46e788);
  puVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x46e79a);
  forwardLutFromBitmap(puVar9,puVar10);
  puVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x46e7c8);
  pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                      CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                      in_stack_fffffffffffffe28);
  sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_78);
  applyLut(puVar10,pvVar8,(int)sVar4);
  *local_8 = local_5e[0];
  local_8[1] = local_60;
  local_110 = local_8 + 2;
  if (local_5e[0] <= local_60) {
    __dest = local_110;
    pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_49 + 1),0);
    memcpy(__dest,pvVar11 + (int)(uint)local_5e[0],
           (long)(int)(((uint)local_60 - (uint)local_5e[0]) + 1));
    local_110 = (ushort *)((long)local_110 + (long)(int)(((uint)local_60 - (uint)local_5e[0]) + 1));
  }
  local_118 = (vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *)0x0;
  while( true ) {
    this = local_118;
    pvVar12 = (vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *)
              std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::size
                        ((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          *)(local_99 + 1));
    iVar1 = (int)(sVar3 >> 0x20);
    if (pvVar12 <= this) break;
    pvVar5 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
             operator[]((vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *
                        )(local_99 + 1),(size_type)local_118);
    for (local_124 = 0; local_124 < pvVar5->size; local_124 = local_124 + 1) {
      wav2Encode(in,(int)((ulong)puVar13 >> 0x20),(int)puVar13,(int)(uVar2 >> 0x20),(int)uVar2,
                 (unsigned_short)((ulong)raw >> 0x30));
    }
    local_118 = (vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *)
                ((long)&(local_118->
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  local_110[0] = 0;
  local_110[1] = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
            );
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_78);
  iVar1 = hufCompress(raw,iVar1,(char *)compressed);
  *(int *)local_110 = iVar1;
  *local_10 = (((int)local_110 + 4) - (int)local_8) + iVar1;
  if (local_20 <= *local_10) {
    *local_10 = (uint)local_20;
    memcpy(local_8,local_18,local_20);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this);
  std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::~vector(this);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return true;
}

Assistant:

static bool CompressPiz(unsigned char *outPtr, unsigned int *outSize,
                        const unsigned char *inPtr, size_t inSize,
                        const std::vector<ChannelInfo> &channelInfo,
                        int data_width, int num_lines) {
  std::vector<unsigned char> bitmap(BITMAP_SIZE);
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !TINYEXR_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  // Assume `inSize` is multiple of 2 or 4.
  std::vector<unsigned short> tmpBuffer(inSize / sizeof(unsigned short));

  std::vector<PIZChannelData> channelData(channelInfo.size());
  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t c = 0; c < channelData.size(); c++) {
    PIZChannelData &cd = channelData[c];

    cd.start = tmpBufferEnd;
    cd.end = cd.start;

    cd.nx = data_width;
    cd.ny = num_lines;
    // cd.ys = c.channel().ySampling;

    size_t pixelSize = sizeof(int);  // UINT and FLOAT
    if (channelInfo[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    cd.size = static_cast<int>(pixelSize / sizeof(short));

    tmpBufferEnd += cd.nx * cd.ny * cd.size;
  }

  const unsigned char *ptr = inPtr;
  for (int y = 0; y < num_lines; ++y) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      size_t n = static_cast<size_t>(cd.nx * cd.size);
      memcpy(cd.end, ptr, n * sizeof(unsigned short));
      ptr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  bitmapFromData(&tmpBuffer.at(0), static_cast<int>(tmpBuffer.size()),
                 bitmap.data(), minNonZero, maxNonZero);

  std::vector<unsigned short> lut(USHORT_RANGE);
  unsigned short maxValue = forwardLutFromBitmap(bitmap.data(), lut.data());
  applyLut(lut.data(), &tmpBuffer.at(0), static_cast<int>(tmpBuffer.size()));

  //
  // Store range compression info in _outBuffer
  //

  char *buf = reinterpret_cast<char *>(outPtr);

  memcpy(buf, &minNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);
  memcpy(buf, &maxNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);

  if (minNonZero <= maxNonZero) {
    memcpy(buf, reinterpret_cast<char *>(&bitmap[0] + minNonZero),
           maxNonZero - minNonZero + 1);
    buf += maxNonZero - minNonZero + 1;
  }

  //
  // Apply wavelet encoding
  //

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Encode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Apply Huffman encoding; append the result to _outBuffer
  //

  // length header(4byte), then huff data. Initialize length header with zero,
  // then later fill it by `length`.
  char *lengthPtr = buf;
  int zero = 0;
  memcpy(buf, &zero, sizeof(int));
  buf += sizeof(int);

  int length =
      hufCompress(&tmpBuffer.at(0), static_cast<int>(tmpBuffer.size()), buf);
  memcpy(lengthPtr, &length, sizeof(int));

  (*outSize) = static_cast<unsigned int>(
      (reinterpret_cast<unsigned char *>(buf) - outPtr) +
      static_cast<unsigned int>(length));

  // Use uncompressed data when compressed data is larger than uncompressed.
  // (Issue 40)
  if ((*outSize) >= inSize) {
    (*outSize) = static_cast<unsigned int>(inSize);
    memcpy(outPtr, inPtr, inSize);
  }
  return true;
}